

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O1

void __thiscall
Qentem::BigInt<unsigned_char,_128U>::Add
          (BigInt<unsigned_char,_128U> *this,uchar number,SizeT32 index)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  undefined8 uVar6;
  int iVar7;
  byte bVar8;
  
  uVar6 = CONCAT71(in_register_00000031,number);
  if ((int)uVar6 != 0) {
    uVar5 = (ulong)index;
    uVar3 = 0x10;
    if (0x10 < index) {
      uVar3 = (ulong)index;
    }
    iVar7 = 1 - index;
    while (uVar3 != uVar5) {
      bVar1 = this->storage_[uVar5];
      bVar8 = bVar1 + (char)uVar6;
      this->storage_[uVar5] = bVar8;
      uVar5 = uVar5 + 1;
      if (bVar1 < bVar8) {
        uVar3 = (ulong)-(iVar7 + -2 + (uint)(bVar1 < bVar8));
        break;
      }
      uVar6 = 1;
      iVar7 = iVar7 + -1;
    }
    uVar2 = (uint)uVar3;
    uVar4 = 0;
    if ((0xf < uVar2) || (uVar4 = uVar2, this->index_ < uVar2)) {
      this->index_ = uVar4;
    }
  }
  return;
}

Assistant:

void Add(Number_T number, SizeT32 index = 0U) noexcept {
        if (number != 0) {
            while (index <= MaxIndex()) {
                const Number_T tmp = storage_[index];
                storage_[index] += number;

                if (storage_[index] > tmp) {
                    break;
                }

                // Overflow.
                number = Number_T{1};
                ++index;
            }

            if (index > MaxIndex()) {
                index_ = 0;
            } else if (index > index_) {
                index_ = index;
            }
        }
    }